

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaV_tostring(lua_State *L,StkId obj)

{
  size_t l;
  GCObject *pGVar1;
  bool bVar2;
  char s [32];
  
  bVar2 = obj->tt == 3;
  if (bVar2) {
    sprintf(s,"%.14g",(obj->value).gc);
    l = strlen(s);
    pGVar1 = (GCObject *)luaS_newlstr(L,s,l);
    (obj->value).gc = pGVar1;
    obj->tt = 4;
  }
  return (uint)bVar2;
}

Assistant:

static int luaV_tostring(lua_State*L,StkId obj){
if(!ttisnumber(obj))
return 0;
else{
char s[32];
lua_Number n=nvalue(obj);
lua_number2str(s,n);
setsvalue(L,obj,luaS_new(L,s));
return 1;
}
}